

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O1

bool __thiscall
cs_impl::any::holder<cs::callable>::compare(holder<cs::callable> *this,baseHolder *obj)

{
  char *__s1;
  char *__s2;
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  bool bVar3;
  
  iVar1 = (*obj->_vptr_baseHolder[2])(obj);
  iVar2 = (*(this->super_baseHolder)._vptr_baseHolder[2])(this);
  __s1 = *(char **)(CONCAT44(extraout_var,iVar1) + 8);
  __s2 = *(char **)(CONCAT44(extraout_var_00,iVar2) + 8);
  if (__s1 == __s2) {
LAB_0013146d:
    bVar3 = this == (holder<cs::callable> *)obj;
  }
  else {
    if (*__s1 != '*') {
      iVar1 = strcmp(__s1,__s2);
      if (iVar1 == 0) goto LAB_0013146d;
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool compare(const baseHolder *obj) const override
			{
				if (obj->type() == this->type())
					return cs_impl::compare(mDat, static_cast<const holder<T> *>(obj)->data());
				else
					return false;
			}